

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O1

BOOL __thiscall
Js::HeapArgumentsObject::SetPropertyWithAttributes
          (HeapArgumentsObject *this,PropertyId propertyId,Var value,PropertyAttributes attributes,
          PropertyValueInfo *info,PropertyOperationFlags flags,SideEffects possibleSideEffects)

{
  BOOL BVar1;
  uint32 local_34 [2];
  uint32 index;
  
  BVar1 = IsFormalArgument(this,propertyId,local_34);
  if (BVar1 == 0) {
    BVar1 = DynamicObject::SetPropertyWithAttributes
                      ((DynamicObject *)this,propertyId,value,attributes,info,flags,
                       possibleSideEffects);
  }
  else {
    ConvertToES5HeapArgumentsObject(this,true);
    BVar1 = ES5HeapArgumentsObject::SetPropertyWithAttributesForFormal
                      ((ES5HeapArgumentsObject *)this,local_34[0],propertyId,value,attributes,info,
                       flags,possibleSideEffects);
  }
  return BVar1;
}

Assistant:

BOOL HeapArgumentsObject::SetPropertyWithAttributes(PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        // This is called by defineProperty in order to change the value in objectArray.
        // We have to intercept this call because
        // in case when we are connected (objectArray item is not used) we need to update the slot value (which is actually used).
        uint32 index;
        if (this->IsFormalArgument(propertyId, &index))
        {
            return this->ConvertToES5HeapArgumentsObject()->SetPropertyWithAttributesForFormal(
                index, propertyId, value, attributes, info, flags, possibleSideEffects);
        }
        return __super::SetPropertyWithAttributes(propertyId, value, attributes, info, flags, possibleSideEffects);
    }